

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdDecomposeInt(Dau_Dsd_t *p,word *pTruth,int nVarsInit)

{
  int local_68 [2];
  int pVars [16];
  int local_20;
  int nVars;
  int Status;
  int nVarsInit_local;
  word *pTruth_local;
  Dau_Dsd_t *p_local;
  
  local_20 = 0;
  Dau_DsdInitialize(p,nVarsInit);
  pVars[0xf] = Dau_DsdMinBase(pTruth,nVarsInit,local_68);
  if ((0 < pVars[0xf]) && (pVars[0xf] <= nVarsInit)) {
    if (pVars[0xf] == 1) {
      Dau_DsdWriteVar(p,local_68[0],(uint)*pTruth & 1);
    }
    else if (pVars[0xf] < 7) {
      local_20 = Dau_Dsd6DecomposeInternal(p,pTruth,local_68,pVars[0xf]);
    }
    else {
      local_20 = Dau_DsdDecomposeInternal(p,pTruth,local_68,pVars[0xf]);
    }
    Dau_DsdFinalize(p);
    return local_20;
  }
  __assert_fail("nVars > 0 && nVars <= nVarsInit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                ,0x76e,"int Dau_DsdDecomposeInt(Dau_Dsd_t *, word *, int)");
}

Assistant:

int Dau_DsdDecomposeInt( Dau_Dsd_t * p, word * pTruth, int nVarsInit )
{
    int Status = 0, nVars, pVars[16];
    Dau_DsdInitialize( p, nVarsInit );
    nVars = Dau_DsdMinBase( pTruth, nVarsInit, pVars );
    assert( nVars > 0 && nVars <= nVarsInit );
    if ( nVars == 1 )
        Dau_DsdWriteVar( p, pVars[0], (int)(pTruth[0] & 1) );
    else if ( nVars <= 6 )
        Status = Dau_Dsd6DecomposeInternal( p, pTruth, pVars, nVars );
    else
        Status = Dau_DsdDecomposeInternal( p, pTruth, pVars, nVars );
    Dau_DsdFinalize( p );
    return Status;
}